

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlcxx2_html.hpp
# Opt level: O3

char * __thiscall
htmlcxx2::HTML::ParserSax::skipComment<char_const*>(ParserSax *this,char *pos,char *end)

{
  char cVar1;
  byte bVar2;
  int iVar3;
  byte *pbVar4;
  byte *pbVar5;
  char *pcVar6;
  
  pcVar6 = pos;
  if (pos != end) {
    pbVar4 = (byte *)(pos + 2);
    do {
      cVar1 = *pos;
      pos = pos + 1;
      if ((pos != end && cVar1 == '-') && (pbVar5 = pbVar4, *pos == '-')) {
        do {
          if (pbVar5 == (byte *)end) {
            return end;
          }
          bVar2 = *pbVar5;
          iVar3 = isspace((uint)bVar2);
          pbVar5 = pbVar5 + 1;
        } while (iVar3 != 0);
        if (bVar2 == 0x3e) {
          return (char *)pbVar5;
        }
      }
      pbVar4 = pbVar4 + 1;
      pcVar6 = end;
    } while (pos != end);
  }
  return pcVar6;
}

Assistant:

It ParserSax::skipComment(It pos, It end)
{
    while (pos != end)
    {
        if (*pos++ == '-' && pos != end && *pos == '-')
        {
            It d(pos);
            while (++pos != end && ::isspace((unsigned char)*pos))
                ;
            if (pos == end || *pos++ == '>')
                break;
            pos = d;
        }
    }
    return pos;
}